

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exposer.cc
# Opt level: O0

void __thiscall
prometheus::Exposer::RegisterAuth
          (Exposer *this,
          function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *authCB,string *realm,string *uri)

{
  Endpoint *this_00;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_68;
  Endpoint *local_38;
  Endpoint *endpoint;
  lock_guard<std::mutex> lock;
  string *uri_local;
  string *realm_local;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *authCB_local;
  Exposer *this_local;
  
  lock._M_device = (mutex_type *)uri;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&endpoint,&this->mutex_);
  this_00 = GetEndpointForUri(this,(string *)lock._M_device);
  local_38 = this_00;
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_68,authCB);
  detail::Endpoint::RegisterAuth(this_00,&local_68,realm);
  std::
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_68);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&endpoint);
  return;
}

Assistant:

void Exposer::RegisterAuth(
    std::function<bool(const std::string&, const std::string&)> authCB,
    const std::string& realm, const std::string& uri) {
  std::lock_guard<std::mutex> lock{mutex_};
  auto& endpoint = GetEndpointForUri(uri);
  endpoint.RegisterAuth(std::move(authCB), realm);
}